

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O0

int luaT_callorderiTM(lua_State *L,TValue *p1,int v2,int flip,int isfloat,TMS event)

{
  int iVar1;
  TValue *io_1;
  TValue *io;
  TValue *p2;
  TValue aux;
  TMS event_local;
  int isfloat_local;
  int flip_local;
  int v2_local;
  TValue *p1_local;
  lua_State *L_local;
  
  if (isfloat == 0) {
    p2 = (TValue *)(long)v2;
    aux.value_.ub = '\x03';
  }
  else {
    p2 = (TValue *)(double)v2;
    aux.value_.ub = '\x13';
  }
  if (flip == 0) {
    io = (TValue *)&p2;
    _flip_local = p1;
  }
  else {
    _flip_local = (TValue *)&p2;
    io = p1;
  }
  aux._8_4_ = event;
  aux._12_4_ = isfloat;
  iVar1 = luaT_callorderTM(L,_flip_local,io,event);
  return iVar1;
}

Assistant:

int luaT_callorderiTM (lua_State *L, const TValue *p1, int v2,
                       int flip, int isfloat, TMS event) {
  TValue aux; const TValue *p2;
  if (isfloat) {
    setfltvalue(&aux, cast_num(v2));
  }
  else
    setivalue(&aux, v2);
  if (flip) {  /* arguments were exchanged? */
    p2 = p1; p1 = &aux;  /* correct them */
  }
  else
    p2 = &aux;
  return luaT_callorderTM(L, p1, p2, event);
}